

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromise_p.h
# Opt level: O3

void __thiscall
QtPromisePrivate::PromiseDataBase<Data,_void_(const_Data_&)>::dispatch
          (PromiseDataBase<Data,_void_(const_Data_&)> *this)

{
  void *pvVar1;
  Data *pDVar2;
  bool bVar3;
  char cVar4;
  iterator iVar5;
  iterator iVar6;
  QObject *pQVar7;
  QEvent *this_00;
  PromiseError error;
  QArrayDataPointer<std::pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_>_>
  local_98;
  QArrayDataPointer<std::pair<QPointer<QThread>,_std::function<void_(const_Data_&)>_>_> local_78;
  _Any_data local_58;
  code *local_48;
  void *local_38;
  
  bVar3 = isPending(this);
  if (!bVar3) {
    QReadWriteLock::lockForWrite();
    local_78.d = (Data *)(this->m_handlers).d.d;
    local_78.ptr = (pair<QPointer<QThread>,_std::function<void_(const_Data_&)>_> *)
                   (this->m_handlers).d.ptr;
    local_78.size = (this->m_handlers).d.size;
    (this->m_handlers).d.size = 0;
    (this->m_handlers).d.d = (Data *)0x0;
    (this->m_handlers).d.ptr = (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
    local_98.d = (this->m_catchers).d.d;
    local_98.ptr = (this->m_catchers).d.ptr;
    local_98.size = (this->m_catchers).d.size;
    (this->m_catchers).d.size = 0;
    (this->m_catchers).d.d = (Data *)0x0;
    (this->m_catchers).d.ptr =
         (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)
         0x0;
    QReadWriteLock::unlock();
    pvVar1 = (this->m_error).m_data._M_exception_object;
    if (pvVar1 == (void *)0x0) {
      (*this->_vptr_PromiseDataBase[2])(this,&local_78);
    }
    else {
      std::__exception_ptr::exception_ptr::_M_addref();
      iVar5 = QList<std::pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_>_>
              ::begin((QList<std::pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_>_>
                       *)&local_98);
      iVar6 = QList<std::pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_>_>
              ::end((QList<std::pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_>_>
                     *)&local_98);
      if (iVar5.i != iVar6.i) {
        do {
          std::function<void_(const_QtPromisePrivate::PromiseError_&)>::function
                    ((function<void_(const_QtPromisePrivate::PromiseError_&)> *)&local_58,
                     &(iVar5.i)->second);
          local_38 = pvVar1;
          if (pvVar1 != (void *)0x0) {
            std::__exception_ptr::exception_ptr::_M_addref();
          }
          pDVar2 = ((iVar5.i)->first).wp.d;
          if ((pDVar2 != (Data *)0x0) &&
             (((iVar5.i)->first).wp.value != (QObject *)0x0 &&
              (pDVar2->strongref)._q_value.super___atomic_base<int>._M_i != 0)) {
            cVar4 = QThread::isFinished();
            if (cVar4 == '\0') {
              pDVar2 = ((iVar5.i)->first).wp.d;
              if ((pDVar2 == (Data *)0x0) ||
                 ((pDVar2->strongref)._q_value.super___atomic_base<int>._M_i == 0)) {
                pQVar7 = (QObject *)0x0;
              }
              else {
                pQVar7 = ((iVar5.i)->first).wp.value;
              }
              pQVar7 = (QObject *)QAbstractEventDispatcher::instance((QThread *)pQVar7);
              if (pQVar7 == (QObject *)0x0) {
                cVar4 = QCoreApplication::closingDown();
                if (cVar4 != '\0') goto LAB_0010d618;
              }
              this_00 = (QEvent *)operator_new(0x38);
              QEvent::QEvent(this_00,None);
              *(undefined ***)this_00 = &PTR__Event_0011a570;
              std::function<void_(const_QtPromisePrivate::PromiseError_&)>::function
                        ((function<void_(const_QtPromisePrivate::PromiseError_&)> *)(this_00 + 0x10)
                         ,(function<void_(const_QtPromisePrivate::PromiseError_&)> *)&local_58);
              *(void **)(this_00 + 0x30) = local_38;
              local_38 = (void *)0x0;
              QCoreApplication::postEvent(pQVar7,this_00,0);
            }
          }
LAB_0010d618:
          if (local_38 != (void *)0x0) {
            std::__exception_ptr::exception_ptr::_M_release();
          }
          if (local_48 != (code *)0x0) {
            (*local_48)(&local_58,&local_58,__destroy_functor);
          }
          iVar5.i = iVar5.i + 1;
        } while (iVar5.i != iVar6.i);
      }
      if (pvVar1 != (void *)0x0) {
        std::__exception_ptr::exception_ptr::_M_release();
      }
    }
    QArrayDataPointer<std::pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_>_>
    ::~QArrayDataPointer(&local_98);
    QArrayDataPointer<std::pair<QPointer<QThread>,_std::function<void_(const_Data_&)>_>_>::
    ~QArrayDataPointer(&local_78);
  }
  return;
}

Assistant:

void dispatch()
    {
        if (isPending()) {
            return;
        }

        // A promise can't be resolved multiple times so once settled, its state can't
        // change. When fulfilled, handlers must be called (a single time) and catchers
        // ignored indefinitely (or vice-versa when the promise is rejected), so make
        // sure to clear both handlers AND catchers when dispatching. This also prevents
        // shared pointer circular reference memory leaks when the owning promise is
        // captured in the handler and/or catcher lambdas.

        m_lock.lockForWrite();
        QVector<Handler> handlers = std::move(m_handlers);
        QVector<Catcher> catchers = std::move(m_catchers);
        m_lock.unlock();

        if (m_error.isNull()) {
            notify(handlers);
            return;
        }

        PromiseError error = m_error;
        Q_ASSERT(!error.isNull());

        for (const auto& catcher : catchers) {
            const auto& fn = catcher.second;
            qtpromise_defer(
                [=]() {
                    fn(error);
                },
                catcher.first);
        }
    }